

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<std::complex<long_double>_>::GetSub
          (TPZMatrix<std::complex<long_double>_> *this,TPZVec<long> *indices,
          TPZFMatrix<std::complex<long_double>_> *block)

{
  undefined8 *puVar1;
  long lVar2;
  complex<long_double> *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  lVar2 = indices->fNElements;
  if (0 < lVar2) {
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_58,this,indices->fStore[lVar5],indices->fStore[lVar6]);
        lVar4 = (block->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
        if ((lVar4 <= lVar5) ||
           ((block->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <= lVar6))
        {
          TPZFMatrix<std::complex<long_double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar4 = lVar4 * lVar6;
        pcVar3 = block->fElem;
        puVar1 = (undefined8 *)(pcVar3[lVar4 + lVar5]._M_value + 0x10);
        *puVar1 = local_48;
        puVar1[1] = uStack_40;
        pcVar3 = pcVar3 + lVar4 + lVar5;
        *(undefined8 *)pcVar3->_M_value = local_58;
        *(undefined8 *)(pcVar3->_M_value + 8) = uStack_50;
        lVar6 = lVar6 + 1;
      } while (lVar2 != lVar6);
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar2);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::GetSub(const TPZVec<int64_t> &indices,TPZFMatrix<TVar> &block) const
{
    int64_t nel = indices.NElements();
    int64_t iel,jel;
    for(iel=0; iel<nel; iel++)
    {
		for(jel=0; jel<nel; jel++)
		{
			block(iel,jel) = GetVal(indices[iel],indices[jel]);
		}
    }
	
}